

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshTListBlock(Parser *this,uint iNumVertices,Mesh *mesh,uint iChannel)

{
  bool bVar1;
  reference pvVar2;
  uint local_38;
  undefined1 auStack_34 [4];
  uint iIndex;
  aiVector3D vTemp;
  int iDepth;
  uint iChannel_local;
  Mesh *mesh_local;
  uint iNumVertices_local;
  Parser *this_local;
  
  vTemp.y = 0.0;
  vTemp.z = (float)iChannel;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (mesh->amTexCoords + iChannel,(ulong)iNumVertices);
  do {
    while (*this->filePtr != '*') {
LAB_00630419:
      if (*this->filePtr == '{') {
        vTemp.y = (float)((int)vTemp.y + 1);
      }
      else if (*this->filePtr == '}') {
        vTemp.y = (float)((int)vTemp.y + -1);
        if (vTemp.y == 0.0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_TVERT_LIST chunk (Level 3)")
        ;
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TVERT",10);
    if (!bVar1) goto LAB_00630419;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_34);
    ParseLV4MeshFloatTriple(this,(ai_real *)auStack_34,&local_38);
    if (local_38 < iNumVertices) {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (mesh->amTexCoords + (uint)vTemp.z,(ulong)local_38);
      pvVar2->x = (float)auStack_34;
      pvVar2->y = (float)iIndex;
      pvVar2->z = vTemp.x;
    }
    else {
      LogWarning(this,"Tvertex has an invalid index. It will be ignored");
    }
    if ((vTemp.x != 0.0) || (NAN(vTemp.x))) {
      mesh->mNumUVComponents[(uint)vTemp.z] = 3;
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshTListBlock(unsigned int iNumVertices,
    ASE::Mesh& mesh, unsigned int iChannel)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.amTexCoords[iChannel].resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_TVERT" ,10))
            {
                aiVector3D vTemp;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.x,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Tvertex has an invalid index. It will be ignored");
                }
                else mesh.amTexCoords[iChannel][iIndex] = vTemp;

                if (0.0f != vTemp.z)
                {
                    // we need 3 coordinate channels
                    mesh.mNumUVComponents[iChannel] = 3;
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_TVERT_LIST");
    }
    return;
}